

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64map.hh
# Opt level: O2

void __thiscall roaring::Roaring64Map::addMany(Roaring64Map *this,size_t n_args,uint64_t *vals)

{
  uint64_t uVar1;
  Roaring *this_00;
  uint32_t uVar2;
  uint32_t key;
  size_t lcv;
  size_t sVar3;
  BulkContext local_40;
  
  local_40.context_.idx = 0;
  local_40.context_.key = 0;
  local_40.context_.typecode = '\0';
  local_40.context_.container._0_7_ = 0;
  local_40.context_.container._7_1_ = 0;
  uVar2 = 0;
  this_00 = (Roaring *)0x0;
  for (sVar3 = 0; n_args != sVar3; sVar3 = sVar3 + 1) {
    uVar1 = vals[sVar3];
    key = (uint32_t)(uVar1 >> 0x20);
    if (this_00 == (Roaring *)0x0 || uVar2 != key) {
      this_00 = lookupOrCreateInner(this,key);
      local_40.context_.container._0_7_ = 0;
      local_40.context_.container._7_1_ = 0;
      local_40.context_.idx = 0;
      local_40.context_.key = 0;
      local_40.context_.typecode = '\0';
      uVar2 = key;
    }
    Roaring::addBulk(this_00,&local_40,(uint32_t)uVar1);
  }
  return;
}

Assistant:

void addMany(size_t n_args, const uint64_t *vals) {
        // Potentially reduce outer map lookups by optimistically
        // assuming that adjacent values will belong to the same inner bitmap.
        Roaring *last_inner_bitmap = nullptr;
        uint32_t last_value_high = 0;
        BulkContext last_bulk_context;
        for (size_t lcv = 0; lcv < n_args; lcv++) {
            auto value = vals[lcv];
            auto value_high = highBytes(value);
            auto value_low = lowBytes(value);
            if (last_inner_bitmap == nullptr || value_high != last_value_high) {
                last_inner_bitmap = &lookupOrCreateInner(value_high);
                last_value_high = value_high;
                last_bulk_context = BulkContext{};
            }
            last_inner_bitmap->addBulk(last_bulk_context, value_low);
        }
    }